

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

NULLCRef * NULLCTypeInfo::GetFunctionContext(NULLCRef obj)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  char *__function;
  uint uVar4;
  NULLCRef *in_RDI;
  uint in_stack_00000008;
  undefined8 *in_stack_0000000c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x15d,"NULLCRef NULLCTypeInfo::GetFunctionContext(NULLCRef)");
  }
  uVar1 = *(uint *)(linker + 0x20c);
  if (in_stack_00000008 < uVar1) {
    lVar2 = *(long *)(linker + 0x200);
    if (*(int *)(lVar2 + 0x10 + (ulong)in_stack_00000008 * 0x50) != 3) {
      uVar1 = *(uint *)(lVar2 + (ulong)in_stack_00000008 * 0x50);
      if (uVar1 < *(uint *)(linker + 0x29c)) {
        uVar4 = 0;
        nullcThrowError("functionGetContext: received type \'%s\' that is not a function",
                        (ulong)uVar1 + *(long *)(linker + 0x290));
        in_RDI->ptr = (char *)0x0;
LAB_001237a8:
        in_RDI->typeID = uVar4;
        return in_RDI;
      }
      __function = 
      "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_00123816;
    }
    uVar4 = *(uint *)(in_stack_0000000c + 1);
    if (*(uint *)(linker + 0x24c) <= uVar4) {
      __function = 
      "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_00123816;
    }
    lVar3 = *(long *)(linker + 0x240);
    in_RDI->ptr = (char *)*in_stack_0000000c;
    in_RDI->typeID = 0;
    uVar4 = *(uint *)(lVar3 + 0x4c + (ulong)uVar4 * 0x94);
    if ((ulong)uVar4 == 0xffffffff) {
      return in_RDI;
    }
    if (uVar4 < uVar1) {
      uVar4 = *(uint *)(lVar2 + 0x24 + (ulong)uVar4 * 0x50);
      goto LAB_001237a8;
    }
  }
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00123816:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

NULLCRef GetFunctionContext(NULLCRef obj)
	{
		assert(linker);
		NULLCRef ret;

		ExternTypeInfo &type = linker->exTypes[obj.typeID];

		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionGetContext: received type '%s' that is not a function", &linker->exSymbols[type.offsetToName]);
			ret.ptr = NULL;
			ret.typeID = 0;
			return ret;
		}

		NULLCFuncPtr *ptr = (NULLCFuncPtr*)obj.ptr;

		ExternFuncInfo &function = linker->exFunctions[ptr->id];
		ret.ptr = (char*)ptr->context;
		ret.typeID = 0;

		if(function.contextType != ~0u)
		{
			ExternTypeInfo &contextType = linker->exTypes[function.contextType];
			ret.typeID = contextType.subType;
		}

		return ret;
	}